

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O3

DataStreamType * __thiscall yactfr::internal::TraceTypeImpl::findDst(TraceTypeImpl *this,TypeId id)

{
  const_iterator cVar1;
  DataStreamType *pDVar2;
  TypeId local_8;
  
  local_8 = id;
  cVar1 = std::
          _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_std::allocator<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_idsToDsts)._M_h,&local_8);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    pDVar2 = (DataStreamType *)0x0;
  }
  else {
    pDVar2 = *(DataStreamType **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false>
                     ._M_cur + 0x10);
  }
  return pDVar2;
}

Assistant:

const DataStreamType *TraceTypeImpl::findDst(const TypeId id) const noexcept
{
    auto it = _idsToDsts.find(id);

    if (it == _idsToDsts.end()) {
        return nullptr;
    }

    return it->second;
}